

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O1

bool tao::pegtl::internal::string<(char)35,(char)35>::
     match<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>>
               (file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> *in)

{
  iterator_t *piVar1;
  size_t *psVar2;
  short *psVar3;
  
  psVar3 = (short *)(in->
                    super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>)
                    .
                    super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                    .
                    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                    .m_current.data;
  if ((1 < (ulong)((long)(in->
                         super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>
                         ).
                         super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                         .
                         super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                         .m_end - (long)psVar3)) && (*psVar3 == 0x2323)) {
    piVar1 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current;
    piVar1->data = piVar1->data + 2;
    psVar2 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current.byte;
    *psVar2 = *psVar2 + 2;
    psVar2 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current.byte_in_line;
    *psVar2 = *psVar2 + 2;
    return true;
  }
  return false;
}

Assistant:

const char* current() const noexcept
            {
               return m_current.data;
            }